

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.cpp
# Opt level: O0

void __thiscall RVO::Agent::computeNewVelocity(Agent *this)

{
  bool bVar1;
  ulong uVar2;
  Obstacle *pOVar3;
  reference pvVar4;
  size_type sVar5;
  reference pvVar6;
  Agent *pAVar7;
  reference pvVar8;
  size_t beginLine;
  size_type sVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float s_00;
  double dVar19;
  float local_5c4;
  float local_5b4;
  float local_5a8;
  float local_568;
  size_t lineFail;
  Vector2 local_3f0;
  Vector2 local_3e8;
  Vector2 local_3e0;
  Vector2 local_3d8;
  Vector2 unitW_3;
  float wLength_1;
  Vector2 local_3c4;
  Vector2 w_1;
  float invTimeStep;
  float dotProduct2;
  Vector2 local_39c;
  Vector2 local_394;
  Vector2 local_38c;
  Vector2 local_384;
  float local_37c;
  Vector2 VStack_378;
  float leg;
  Vector2 local_370;
  Vector2 local_368;
  Vector2 unitW_2;
  float wLength;
  float dotProduct1;
  float wLengthSq;
  Vector2 local_34c;
  Vector2 w;
  Vector2 u;
  Line line_1;
  float combinedRadiusSq;
  float combinedRadius;
  float distSq;
  Vector2 relativeVelocity;
  Vector2 relativePosition;
  Agent *other;
  size_t i_1;
  float invTimeHorizon;
  size_t numObstLines;
  Vector2 local_2e4;
  Vector2 local_2dc;
  Vector2 local_2d4;
  Vector2 local_2cc;
  Vector2 local_2c4;
  Vector2 local_2bc;
  Vector2 local_2b4;
  Vector2 local_2ac;
  Vector2 local_2a4;
  Vector2 local_29c;
  Vector2 local_294;
  Vector2 local_28c;
  Vector2 local_284;
  float local_27c;
  Vector2 VStack_278;
  float distSqRight;
  Vector2 local_270;
  Vector2 local_268;
  float local_260;
  Vector2 VStack_25c;
  float distSqLeft;
  Vector2 local_254;
  Vector2 local_24c;
  float local_244;
  Vector2 VStack_240;
  float distSqCutoff;
  Vector2 local_238;
  Vector2 local_230;
  Vector2 local_228;
  Vector2 local_220;
  Vector2 unitW_1;
  Vector2 local_208;
  Vector2 local_200;
  Vector2 local_1f8;
  Vector2 unitW;
  Vector2 VStack_1e4;
  float tRight;
  float local_1dc;
  Vector2 VStack_1d8;
  float tLeft;
  float local_1d0;
  Vector2 VStack_1cc;
  float t;
  Vector2 cutoffVec;
  Vector2 local_1bc;
  Vector2 rightCutoff;
  Vector2 local_1ac;
  Vector2 leftCutoff;
  Vector2 local_19c;
  byte local_192;
  byte local_191;
  bool isRightLegForeign;
  Obstacle *pOStack_190;
  bool isLeftLegForeign;
  Obstacle *leftNeighbor;
  Vector2 local_180;
  float local_178;
  Vector2 VStack_174;
  float leg2_1;
  Vector2 local_16c;
  Vector2 local_164;
  float local_15c;
  float leg1_1;
  Vector2 local_150;
  Vector2 local_148;
  Vector2 local_140;
  float local_138;
  float leg2;
  Vector2 local_12c;
  Vector2 local_124;
  Vector2 local_11c;
  float local_114;
  Vector2 VStack_110;
  float leg1;
  Vector2 rightLegDirection;
  Vector2 leftLegDirection;
  Vector2 local_f8;
  Vector2 local_f0;
  Vector2 local_e8;
  Vector2 local_e0;
  Vector2 local_d8;
  Vector2 local_d0;
  Vector2 local_c8;
  undefined1 local_c0 [8];
  Line line;
  Vector2 local_a4;
  Vector2 local_9c;
  float local_94;
  Vector2 VStack_90;
  float distSqLine;
  float local_88;
  Vector2 VStack_84;
  float s;
  Vector2 obstacleVector;
  float radiusSq;
  float distSq2;
  float distSq1;
  Vector2 local_68;
  Vector2 local_60;
  Vector2 local_58;
  ulong local_50;
  size_t j;
  Vector2 VStack_40;
  bool alreadyCovered;
  Vector2 relativePosition2;
  Vector2 relativePosition1;
  Obstacle *obstacle2;
  Obstacle *obstacle1;
  size_t i;
  float invTimeHorizonObst;
  Agent *this_local;
  
  std::vector<RVO::Line,_std::allocator<RVO::Line>_>::clear(&this->orcaLines_);
  fVar10 = 1.0 / this->timeHorizonObst_;
  obstacle1 = (Obstacle *)0x0;
  do {
    pOVar3 = (Obstacle *)
             std::
             vector<std::pair<float,_const_RVO::Obstacle_*>,_std::allocator<std::pair<float,_const_RVO::Obstacle_*>_>_>
             ::size(&this->obstacleNeighbors_);
    if (pOVar3 <= obstacle1) {
      sVar5 = std::vector<RVO::Line,_std::allocator<RVO::Line>_>::size(&this->orcaLines_);
      fVar10 = 1.0 / this->timeHorizon_;
      for (other = (Agent *)0x0;
          pAVar7 = (Agent *)std::
                            vector<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
                            ::size(&this->agentNeighbors_), other < pAVar7;
          other = (Agent *)((long)&(other->agentNeighbors_).
                                   super__Vector_base<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 1)) {
        pvVar8 = std::
                 vector<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
                 ::operator[](&this->agentNeighbors_,(size_type)other);
        pAVar7 = pvVar8->second;
        relativeVelocity = Vector2::operator-(&pAVar7->position_,&this->position_);
        _combinedRadius = Vector2::operator-(&this->velocity_,&pAVar7->velocity_);
        fVar11 = absSq(&relativeVelocity);
        line_1.direction.y_ = this->radius_ + pAVar7->radius_;
        line_1.direction.x_ = sqr(line_1.direction.y_);
        Line::Line((Line *)&u);
        Vector2::Vector2(&w);
        if (fVar11 <= line_1.direction.x_) {
          w_1.x_ = 1.0 / this->sim_->timeStep_;
          register0x00001200 = operator*(w_1.x_,&relativeVelocity);
          local_3c4 = Vector2::operator-((Vector2 *)&combinedRadius,(Vector2 *)&unitW_3.y_);
          abs((int)&local_3c4);
          unitW_3.x_ = s_00;
          local_3d8 = Vector2::operator/(&local_3c4,s_00);
          fVar11 = Vector2::y(&local_3d8);
          fVar12 = Vector2::x(&local_3d8);
          Vector2::Vector2(&local_3e0,fVar11,-fVar12);
          line_1.point = local_3e0;
          local_3e8 = operator*(line_1.direction.y_ * w_1.x_ - unitW_3.x_,&local_3d8);
          w = local_3e8;
        }
        else {
          _dotProduct1 = operator*(fVar10,&relativeVelocity);
          local_34c = Vector2::operator-((Vector2 *)&combinedRadius,(Vector2 *)&dotProduct1);
          fVar12 = absSq(&local_34c);
          unitW_2.y_ = Vector2::operator*(&local_34c,&relativeVelocity);
          if ((0.0 <= unitW_2.y_) ||
             (fVar18 = sqr(unitW_2.y_), fVar18 <= line_1.direction.x_ * fVar12)) {
            dVar19 = std::sqrt((double)(ulong)(uint)(fVar11 - line_1.direction.x_));
            local_37c = SUB84(dVar19,0);
            fVar12 = det(&relativeVelocity,&local_34c);
            if (fVar12 <= 0.0) {
              fVar17 = Vector2::x(&relativeVelocity);
              fVar12 = local_37c;
              fVar13 = Vector2::y(&relativeVelocity);
              fVar13 = fVar13 * line_1.direction.y_;
              fVar14 = Vector2::x(&relativeVelocity);
              fVar18 = line_1.direction.y_;
              fVar15 = Vector2::y(&relativeVelocity);
              Vector2::Vector2((Vector2 *)&stack0xfffffffffffffc5c,fVar17 * fVar12 + fVar13,
                               fVar15 * local_37c - fVar14 * fVar18);
              local_39c = Vector2::operator-((Vector2 *)&stack0xfffffffffffffc5c);
              local_394 = Vector2::operator/(&local_39c,fVar11);
              line_1.point = local_394;
            }
            else {
              fVar17 = Vector2::x(&relativeVelocity);
              fVar12 = local_37c;
              fVar13 = Vector2::y(&relativeVelocity);
              fVar13 = fVar13 * line_1.direction.y_;
              fVar14 = Vector2::x(&relativeVelocity);
              fVar18 = line_1.direction.y_;
              fVar15 = Vector2::y(&relativeVelocity);
              Vector2::Vector2(&local_38c,fVar17 * fVar12 - fVar13,
                               fVar14 * fVar18 + fVar15 * local_37c);
              local_384 = Vector2::operator/(&local_38c,fVar11);
              line_1.point = local_384;
            }
            fVar11 = Vector2::operator*((Vector2 *)&combinedRadius,&line_1.point);
            register0x00001200 = operator*(fVar11,&line_1.point);
            w = Vector2::operator-((Vector2 *)&w_1.y_,(Vector2 *)&combinedRadius);
          }
          else {
            dVar19 = std::sqrt((double)(ulong)(uint)fVar12);
            unitW_2.x_ = SUB84(dVar19,0);
            local_368 = Vector2::operator/(&local_34c,unitW_2.x_);
            fVar11 = Vector2::y(&local_368);
            fVar12 = Vector2::x(&local_368);
            Vector2::Vector2(&local_370,fVar11,-fVar12);
            line_1.point = local_370;
            VStack_378 = operator*(line_1.direction.y_ * fVar10 - unitW_2.x_,&local_368);
            w = VStack_378;
          }
        }
        lineFail = (size_t)operator*(0.5,&w);
        local_3f0 = Vector2::operator+(&this->velocity_,(Vector2 *)&lineFail);
        u = local_3f0;
        std::vector<RVO::Line,_std::allocator<RVO::Line>_>::push_back
                  (&this->orcaLines_,(value_type *)&u);
      }
      beginLine = linearProgram2(&this->orcaLines_,this->maxSpeed_,&this->prefVelocity_,false,
                                 &this->newVelocity_);
      sVar9 = std::vector<RVO::Line,_std::allocator<RVO::Line>_>::size(&this->orcaLines_);
      if (beginLine < sVar9) {
        linearProgram3(&this->orcaLines_,sVar5,beginLine,this->maxSpeed_,&this->newVelocity_);
      }
      return;
    }
    pvVar4 = std::
             vector<std::pair<float,_const_RVO::Obstacle_*>,_std::allocator<std::pair<float,_const_RVO::Obstacle_*>_>_>
             ::operator[](&this->obstacleNeighbors_,(size_type)obstacle1);
    obstacle2 = pvVar4->second;
    relativePosition1 = *(Vector2 *)((long)obstacle2 + 8);
    relativePosition2 = Vector2::operator-((Vector2 *)((long)obstacle2 + 0x10),&this->position_);
    VStack_40 = Vector2::operator-((Vector2 *)((long)relativePosition1 + 0x10),&this->position_);
    j._7_1_ = 0;
    for (local_50 = 0; uVar2 = local_50,
        sVar5 = std::vector<RVO::Line,_std::allocator<RVO::Line>_>::size(&this->orcaLines_),
        uVar2 < sVar5; local_50 = local_50 + 1) {
      local_60 = operator*(fVar10,&relativePosition2);
      pvVar6 = std::vector<RVO::Line,_std::allocator<RVO::Line>_>::operator[]
                         (&this->orcaLines_,local_50);
      local_58 = Vector2::operator-(&local_60,&pvVar6->point);
      pvVar6 = std::vector<RVO::Line,_std::allocator<RVO::Line>_>::operator[]
                         (&this->orcaLines_,local_50);
      fVar11 = det(&local_58,&pvVar6->direction);
      bVar1 = false;
      if (-1e-05 <= -fVar10 * this->radius_ + fVar11) {
        _distSq2 = operator*(fVar10,&stack0xffffffffffffffc0);
        pvVar6 = std::vector<RVO::Line,_std::allocator<RVO::Line>_>::operator[]
                           (&this->orcaLines_,local_50);
        local_68 = Vector2::operator-((Vector2 *)&distSq2,&pvVar6->point);
        pvVar6 = std::vector<RVO::Line,_std::allocator<RVO::Line>_>::operator[]
                           (&this->orcaLines_,local_50);
        fVar11 = det(&local_68,&pvVar6->direction);
        bVar1 = -1e-05 <= -fVar10 * this->radius_ + fVar11;
      }
      if (bVar1) {
        j._7_1_ = 1;
        break;
      }
    }
    if ((j._7_1_ & 1) == 0) {
      fVar11 = absSq(&relativePosition2);
      obstacleVector.y_ = absSq(&stack0xffffffffffffffc0);
      obstacleVector.x_ = sqr(this->radius_);
      VStack_84 = Vector2::operator-((Vector2 *)((long)relativePosition1 + 0x10),
                                     (Vector2 *)((long)obstacle2 + 0x10));
      VStack_90 = Vector2::operator-(&relativePosition2);
      fVar12 = Vector2::operator*(&stack0xffffffffffffff70,&stack0xffffffffffffff7c);
      local_88 = absSq(&stack0xffffffffffffff7c);
      local_88 = fVar12 / local_88;
      local_a4 = Vector2::operator-(&relativePosition2);
      register0x00001200 = operator*(local_88,&stack0xffffffffffffff7c);
      local_9c = Vector2::operator-(&local_a4,(Vector2 *)&line.direction.y_);
      local_94 = absSq(&local_9c);
      Line::Line((Line *)local_c0);
      if ((0.0 <= local_88) || (obstacleVector.x_ < fVar11)) {
        if ((local_88 <= 1.0) || (obstacleVector.x_ < obstacleVector.y_)) {
          if (((local_88 < 0.0) || (1.0 <= local_88)) || (obstacleVector.x_ < local_94)) {
            Vector2::Vector2(&rightLegDirection);
            Vector2::Vector2(&stack0xfffffffffffffef0);
            if ((0.0 <= local_88) || (obstacleVector.x_ < local_94)) {
              if ((local_88 <= 1.0) || (obstacleVector.x_ < local_94)) {
                if ((obstacle2->isConvex_ & 1) == 0) {
                  VStack_174 = Vector2::operator-((Vector2 *)((long)obstacle2 + 0x20));
                  rightLegDirection = VStack_174;
                }
                else {
                  dVar19 = std::sqrt((double)(ulong)(uint)(fVar11 - obstacleVector.x_));
                  local_15c = SUB84(dVar19,0);
                  fVar13 = Vector2::x(&relativePosition2);
                  fVar17 = local_15c;
                  fVar14 = Vector2::y(&relativePosition2);
                  fVar12 = this->radius_;
                  fVar15 = Vector2::x(&relativePosition2);
                  fVar18 = this->radius_;
                  fVar16 = Vector2::y(&relativePosition2);
                  Vector2::Vector2(&local_16c,fVar13 * fVar17 - fVar14 * fVar12,
                                   fVar15 * fVar18 + fVar16 * local_15c);
                  local_164 = Vector2::operator/(&local_16c,fVar11);
                  rightLegDirection = local_164;
                }
                if ((*(byte *)relativePosition1 & 1) == 0) {
                  VStack_110 = *(Vector2 *)((long)obstacle2 + 0x20);
                }
                else {
                  dVar19 = std::sqrt((double)(ulong)(uint)(obstacleVector.y_ - obstacleVector.x_));
                  local_178 = SUB84(dVar19,0);
                  fVar17 = Vector2::x(&stack0xffffffffffffffc0);
                  fVar18 = local_178;
                  fVar13 = Vector2::y(&stack0xffffffffffffffc0);
                  fVar11 = this->radius_;
                  fVar14 = Vector2::x(&stack0xffffffffffffffc0);
                  fVar12 = this->radius_;
                  fVar15 = Vector2::y(&stack0xffffffffffffffc0);
                  Vector2::Vector2((Vector2 *)&leftNeighbor,fVar17 * fVar18 + fVar13 * fVar11,
                                   fVar15 * local_178 - fVar14 * fVar12);
                  local_180 = Vector2::operator/((Vector2 *)&leftNeighbor,obstacleVector.y_);
                  VStack_110 = local_180;
                }
              }
              else {
                if ((*(byte *)relativePosition1 & 1) == 0) goto LAB_00121e59;
                dVar19 = std::sqrt((double)(ulong)(uint)(obstacleVector.y_ - obstacleVector.x_));
                local_138 = SUB84(dVar19,0);
                fVar17 = Vector2::x(&stack0xffffffffffffffc0);
                fVar18 = local_138;
                fVar13 = Vector2::y(&stack0xffffffffffffffc0);
                fVar11 = this->radius_;
                fVar14 = Vector2::x(&stack0xffffffffffffffc0);
                fVar12 = this->radius_;
                fVar15 = Vector2::y(&stack0xffffffffffffffc0);
                Vector2::Vector2(&local_148,fVar17 * fVar18 - fVar13 * fVar11,
                                 fVar14 * fVar12 + fVar15 * local_138);
                local_140 = Vector2::operator/(&local_148,obstacleVector.y_);
                rightLegDirection = local_140;
                fVar17 = Vector2::x(&stack0xffffffffffffffc0);
                fVar18 = local_138;
                fVar13 = Vector2::y(&stack0xffffffffffffffc0);
                fVar11 = this->radius_;
                fVar14 = Vector2::x(&stack0xffffffffffffffc0);
                fVar12 = this->radius_;
                fVar15 = Vector2::y(&stack0xffffffffffffffc0);
                Vector2::Vector2((Vector2 *)&stack0xfffffffffffffea8,
                                 fVar17 * fVar18 + fVar13 * fVar11,
                                 fVar15 * local_138 - fVar14 * fVar12);
                local_150 = Vector2::operator/((Vector2 *)&stack0xfffffffffffffea8,obstacleVector.y_
                                              );
                VStack_110 = local_150;
                obstacle2 = (Obstacle *)relativePosition1;
              }
            }
            else {
              if ((obstacle2->isConvex_ & 1) == 0) goto LAB_00121e59;
              dVar19 = std::sqrt((double)(ulong)(uint)(fVar11 - obstacleVector.x_));
              local_114 = SUB84(dVar19,0);
              fVar13 = Vector2::x(&relativePosition2);
              fVar17 = local_114;
              fVar14 = Vector2::y(&relativePosition2);
              fVar12 = this->radius_;
              fVar15 = Vector2::x(&relativePosition2);
              fVar18 = this->radius_;
              fVar16 = Vector2::y(&relativePosition2);
              Vector2::Vector2(&local_124,fVar13 * fVar17 - fVar14 * fVar12,
                               fVar15 * fVar18 + fVar16 * local_114);
              local_11c = Vector2::operator/(&local_124,fVar11);
              rightLegDirection = local_11c;
              fVar13 = Vector2::x(&relativePosition2);
              fVar17 = local_114;
              fVar14 = Vector2::y(&relativePosition2);
              fVar12 = this->radius_;
              fVar15 = Vector2::x(&relativePosition2);
              fVar18 = this->radius_;
              fVar16 = Vector2::y(&relativePosition2);
              Vector2::Vector2((Vector2 *)&stack0xfffffffffffffecc,fVar13 * fVar17 + fVar14 * fVar12
                               ,fVar16 * local_114 - fVar15 * fVar18);
              local_12c = Vector2::operator/((Vector2 *)&stack0xfffffffffffffecc,fVar11);
              VStack_110 = local_12c;
              relativePosition1 = (Vector2)obstacle2;
            }
            pOStack_190 = obstacle2->prevObstacle_;
            local_191 = 0;
            local_192 = 0;
            bVar1 = false;
            if ((obstacle2->isConvex_ & 1U) != 0) {
              local_19c = Vector2::operator-(&pOStack_190->unitDir_);
              fVar11 = det(&rightLegDirection,&local_19c);
              bVar1 = 0.0 <= fVar11;
            }
            if (bVar1) {
              leftCutoff = Vector2::operator-(&pOStack_190->unitDir_);
              local_191 = 1;
              rightLegDirection = leftCutoff;
            }
            if (((*(byte *)relativePosition1 & 1) != 0) &&
               (fVar11 = det(&stack0xfffffffffffffef0,(Vector2 *)((long)relativePosition1 + 0x20)),
               fVar11 <= 0.0)) {
              VStack_110 = *(Vector2 *)((long)relativePosition1 + 0x20);
              local_192 = 1;
            }
            rightCutoff = Vector2::operator-(&obstacle2->point_,&this->position_);
            local_1ac = operator*(fVar10,&rightCutoff);
            cutoffVec = Vector2::operator-((Vector2 *)((long)relativePosition1 + 0x10),
                                           &this->position_);
            local_1bc = operator*(fVar10,&cutoffVec);
            VStack_1cc = Vector2::operator-(&local_1bc,&local_1ac);
            if ((Vector2)obstacle2 == relativePosition1) {
              local_568 = 0.5;
            }
            else {
              VStack_1d8 = Vector2::operator-(&this->velocity_,&local_1ac);
              local_568 = Vector2::operator*(&stack0xfffffffffffffe28,&stack0xfffffffffffffe34);
              fVar11 = absSq(&stack0xfffffffffffffe34);
              local_568 = local_568 / fVar11;
            }
            local_1d0 = local_568;
            VStack_1e4 = Vector2::operator-(&this->velocity_,&local_1ac);
            local_1dc = Vector2::operator*(&stack0xfffffffffffffe1c,&rightLegDirection);
            unitW = Vector2::operator-(&this->velocity_,&local_1bc);
            fVar11 = Vector2::operator*(&unitW,&stack0xfffffffffffffef0);
            if (((local_1d0 < 0.0) && (local_1dc < 0.0)) ||
               (((Vector2)obstacle2 == relativePosition1 && ((local_1dc < 0.0 && (fVar11 < 0.0))))))
            {
              local_200 = Vector2::operator-(&this->velocity_,&local_1ac);
              local_1f8 = normalize(&local_200);
              fVar11 = Vector2::y(&local_1f8);
              fVar12 = Vector2::x(&local_1f8);
              Vector2::Vector2(&local_208,fVar11,-fVar12);
              line.point = local_208;
              unitW_1 = operator*(this->radius_ * fVar10,&local_1f8);
              local_c0 = (undefined1  [8])Vector2::operator+(&local_1ac,&unitW_1);
              std::vector<RVO::Line,_std::allocator<RVO::Line>_>::push_back
                        (&this->orcaLines_,(value_type *)local_c0);
            }
            else if ((local_1d0 <= 1.0) || (0.0 <= fVar11)) {
              if ((local_1d0 < 0.0) ||
                 ((1.0 < local_1d0 || ((Vector2)obstacle2 == relativePosition1)))) {
                local_5a8 = std::numeric_limits<float>::infinity();
              }
              else {
                VStack_25c = operator*(local_1d0,&stack0xfffffffffffffe34);
                local_254 = Vector2::operator+(&local_1ac,&stack0xfffffffffffffda4);
                local_24c = Vector2::operator-(&this->velocity_,&local_254);
                local_5a8 = absSq(&local_24c);
              }
              local_244 = local_5a8;
              if (0.0 <= local_1dc) {
                VStack_278 = operator*(local_1dc,&rightLegDirection);
                local_270 = Vector2::operator+(&local_1ac,&stack0xfffffffffffffd88);
                local_268 = Vector2::operator-(&this->velocity_,&local_270);
                local_5b4 = absSq(&local_268);
              }
              else {
                local_5b4 = std::numeric_limits<float>::infinity();
              }
              local_260 = local_5b4;
              if (0.0 <= fVar11) {
                local_294 = operator*(fVar11,&stack0xfffffffffffffef0);
                local_28c = Vector2::operator+(&local_1bc,&local_294);
                local_284 = Vector2::operator-(&this->velocity_,&local_28c);
                local_5c4 = absSq(&local_284);
              }
              else {
                local_5c4 = std::numeric_limits<float>::infinity();
              }
              local_27c = local_5c4;
              if ((local_260 < local_244) || (local_5c4 < local_244)) {
                if (local_5c4 < local_260) {
                  if ((local_192 & 1) == 0) {
                    local_2d4 = Vector2::operator-(&stack0xfffffffffffffef0);
                    fVar11 = this->radius_;
                    line.point = local_2d4;
                    fVar12 = Vector2::y(&line.point);
                    fVar18 = Vector2::x(&line.point);
                    Vector2::Vector2((Vector2 *)((long)&numObstLines + 4),-fVar12,fVar18);
                    local_2e4 = operator*(fVar11 * fVar10,(Vector2 *)((long)&numObstLines + 4));
                    local_2dc = Vector2::operator+(&local_1bc,&local_2e4);
                    local_c0 = (undefined1  [8])local_2dc;
                    std::vector<RVO::Line,_std::allocator<RVO::Line>_>::push_back
                              (&this->orcaLines_,(value_type *)local_c0);
                  }
                }
                else if ((local_191 & 1) == 0) {
                  line.point = rightLegDirection;
                  fVar11 = this->radius_;
                  fVar12 = Vector2::y(&line.point);
                  fVar18 = Vector2::x(&line.point);
                  Vector2::Vector2(&local_2cc,-fVar12,fVar18);
                  local_2c4 = operator*(fVar11 * fVar10,&local_2cc);
                  local_2bc = Vector2::operator+(&local_1ac,&local_2c4);
                  local_c0 = (undefined1  [8])local_2bc;
                  std::vector<RVO::Line,_std::allocator<RVO::Line>_>::push_back
                            (&this->orcaLines_,(value_type *)local_c0);
                }
              }
              else {
                local_29c = Vector2::operator-(&obstacle2->unitDir_);
                fVar11 = this->radius_;
                line.point = local_29c;
                fVar12 = Vector2::y(&line.point);
                fVar18 = Vector2::x(&line.point);
                Vector2::Vector2(&local_2b4,-fVar12,fVar18);
                local_2ac = operator*(fVar11 * fVar10,&local_2b4);
                local_2a4 = Vector2::operator+(&local_1ac,&local_2ac);
                local_c0 = (undefined1  [8])local_2a4;
                std::vector<RVO::Line,_std::allocator<RVO::Line>_>::push_back
                          (&this->orcaLines_,(value_type *)local_c0);
              }
            }
            else {
              local_228 = Vector2::operator-(&this->velocity_,&local_1bc);
              local_220 = normalize(&local_228);
              fVar11 = Vector2::y(&local_220);
              fVar12 = Vector2::x(&local_220);
              Vector2::Vector2(&local_230,fVar11,-fVar12);
              line.point = local_230;
              VStack_240 = operator*(this->radius_ * fVar10,&local_220);
              local_238 = Vector2::operator+(&local_1bc,&stack0xfffffffffffffdc0);
              local_c0 = (undefined1  [8])local_238;
              std::vector<RVO::Line,_std::allocator<RVO::Line>_>::push_back
                        (&this->orcaLines_,(value_type *)local_c0);
            }
          }
          else {
            Vector2::Vector2(&local_f8,0.0,0.0);
            local_c0._0_4_ = local_f8.x_;
            local_c0._4_4_ = local_f8.y_;
            line.point = Vector2::operator-((Vector2 *)((long)obstacle2 + 0x20));
            std::vector<RVO::Line,_std::allocator<RVO::Line>_>::push_back
                      (&this->orcaLines_,(value_type *)local_c0);
          }
        }
        else if (((*(byte *)relativePosition1 & 1) != 0) &&
                (fVar11 = det(&stack0xffffffffffffffc0,(Vector2 *)((long)relativePosition1 + 0x20)),
                0.0 <= fVar11)) {
          Vector2::Vector2(&local_e0,0.0,0.0);
          local_c0._0_4_ = local_e0.x_;
          local_c0._4_4_ = local_e0.y_;
          fVar11 = Vector2::y(&stack0xffffffffffffffc0);
          fVar12 = Vector2::x(&stack0xffffffffffffffc0);
          Vector2::Vector2(&local_f0,-fVar11,fVar12);
          local_e8 = normalize(&local_f0);
          line.point = local_e8;
          std::vector<RVO::Line,_std::allocator<RVO::Line>_>::push_back
                    (&this->orcaLines_,(value_type *)local_c0);
        }
      }
      else if ((obstacle2->isConvex_ & 1) != 0) {
        Vector2::Vector2(&local_c8,0.0,0.0);
        local_c0._0_4_ = local_c8.x_;
        local_c0._4_4_ = local_c8.y_;
        fVar11 = Vector2::y(&relativePosition2);
        fVar12 = Vector2::x(&relativePosition2);
        Vector2::Vector2(&local_d8,-fVar11,fVar12);
        local_d0 = normalize(&local_d8);
        line.point = local_d0;
        std::vector<RVO::Line,_std::allocator<RVO::Line>_>::push_back
                  (&this->orcaLines_,(value_type *)local_c0);
      }
    }
LAB_00121e59:
    obstacle1 = (Obstacle *)&obstacle1->field_0x1;
  } while( true );
}

Assistant:

void Agent::computeNewVelocity()
	{
		orcaLines_.clear();

		const float invTimeHorizonObst = 1.0f / timeHorizonObst_;

		/* Create obstacle ORCA lines. */
		for (size_t i = 0; i < obstacleNeighbors_.size(); ++i) {

			const Obstacle *obstacle1 = obstacleNeighbors_[i].second;
			const Obstacle *obstacle2 = obstacle1->nextObstacle_;

			const Vector2 relativePosition1 = obstacle1->point_ - position_;
			const Vector2 relativePosition2 = obstacle2->point_ - position_;

			/*
			 * Check if velocity obstacle of obstacle is already taken care of by
			 * previously constructed obstacle ORCA lines.
			 */
			bool alreadyCovered = false;

			for (size_t j = 0; j < orcaLines_.size(); ++j) {
				if (det(invTimeHorizonObst * relativePosition1 - orcaLines_[j].point, orcaLines_[j].direction) - invTimeHorizonObst * radius_ >= -RVO_EPSILON && det(invTimeHorizonObst * relativePosition2 - orcaLines_[j].point, orcaLines_[j].direction) - invTimeHorizonObst * radius_ >=  -RVO_EPSILON) {
					alreadyCovered = true;
					break;
				}
			}

			if (alreadyCovered) {
				continue;
			}

			/* Not yet covered. Check for collisions. */

			const float distSq1 = absSq(relativePosition1);
			const float distSq2 = absSq(relativePosition2);

			const float radiusSq = sqr(radius_);

			const Vector2 obstacleVector = obstacle2->point_ - obstacle1->point_;
			const float s = (-relativePosition1 * obstacleVector) / absSq(obstacleVector);
			const float distSqLine = absSq(-relativePosition1 - s * obstacleVector);

			Line line;

			if (s < 0.0f && distSq1 <= radiusSq) {
				/* Collision with left vertex. Ignore if non-convex. */
				if (obstacle1->isConvex_) {
					line.point = Vector2(0.0f, 0.0f);
					line.direction = normalize(Vector2(-relativePosition1.y(), relativePosition1.x()));
					orcaLines_.push_back(line);
				}

				continue;
			}
			else if (s > 1.0f && distSq2 <= radiusSq) {
				/* Collision with right vertex. Ignore if non-convex
				 * or if it will be taken care of by neighoring obstace */
				if (obstacle2->isConvex_ && det(relativePosition2, obstacle2->unitDir_) >= 0.0f) {
					line.point = Vector2(0.0f, 0.0f);
					line.direction = normalize(Vector2(-relativePosition2.y(), relativePosition2.x()));
					orcaLines_.push_back(line);
				}

				continue;
			}
			else if (s >= 0.0f && s < 1.0f && distSqLine <= radiusSq) {
				/* Collision with obstacle segment. */
				line.point = Vector2(0.0f, 0.0f);
				line.direction = -obstacle1->unitDir_;
				orcaLines_.push_back(line);
				continue;
			}

			/*
			 * No collision.
			 * Compute legs. When obliquely viewed, both legs can come from a single
			 * vertex. Legs extend cut-off line when nonconvex vertex.
			 */

			Vector2 leftLegDirection, rightLegDirection;

			if (s < 0.0f && distSqLine <= radiusSq) {
				/*
				 * Obstacle viewed obliquely so that left vertex
				 * defines velocity obstacle.
				 */
				if (!obstacle1->isConvex_) {
					/* Ignore obstacle. */
					continue;
				}

				obstacle2 = obstacle1;

				const float leg1 = std::sqrt(distSq1 - radiusSq);
				leftLegDirection = Vector2(relativePosition1.x() * leg1 - relativePosition1.y() * radius_, relativePosition1.x() * radius_ + relativePosition1.y() * leg1) / distSq1;
				rightLegDirection = Vector2(relativePosition1.x() * leg1 + relativePosition1.y() * radius_, -relativePosition1.x() * radius_ + relativePosition1.y() * leg1) / distSq1;
			}
			else if (s > 1.0f && distSqLine <= radiusSq) {
				/*
				 * Obstacle viewed obliquely so that
				 * right vertex defines velocity obstacle.
				 */
				if (!obstacle2->isConvex_) {
					/* Ignore obstacle. */
					continue;
				}

				obstacle1 = obstacle2;

				const float leg2 = std::sqrt(distSq2 - radiusSq);
				leftLegDirection = Vector2(relativePosition2.x() * leg2 - relativePosition2.y() * radius_, relativePosition2.x() * radius_ + relativePosition2.y() * leg2) / distSq2;
				rightLegDirection = Vector2(relativePosition2.x() * leg2 + relativePosition2.y() * radius_, -relativePosition2.x() * radius_ + relativePosition2.y() * leg2) / distSq2;
			}
			else {
				/* Usual situation. */
				if (obstacle1->isConvex_) {
					const float leg1 = std::sqrt(distSq1 - radiusSq);
					leftLegDirection = Vector2(relativePosition1.x() * leg1 - relativePosition1.y() * radius_, relativePosition1.x() * radius_ + relativePosition1.y() * leg1) / distSq1;
				}
				else {
					/* Left vertex non-convex; left leg extends cut-off line. */
					leftLegDirection = -obstacle1->unitDir_;
				}

				if (obstacle2->isConvex_) {
					const float leg2 = std::sqrt(distSq2 - radiusSq);
					rightLegDirection = Vector2(relativePosition2.x() * leg2 + relativePosition2.y() * radius_, -relativePosition2.x() * radius_ + relativePosition2.y() * leg2) / distSq2;
				}
				else {
					/* Right vertex non-convex; right leg extends cut-off line. */
					rightLegDirection = obstacle1->unitDir_;
				}
			}

			/*
			 * Legs can never point into neighboring edge when convex vertex,
			 * take cutoff-line of neighboring edge instead. If velocity projected on
			 * "foreign" leg, no constraint is added.
			 */

			const Obstacle *const leftNeighbor = obstacle1->prevObstacle_;

			bool isLeftLegForeign = false;
			bool isRightLegForeign = false;

			if (obstacle1->isConvex_ && det(leftLegDirection, -leftNeighbor->unitDir_) >= 0.0f) {
				/* Left leg points into obstacle. */
				leftLegDirection = -leftNeighbor->unitDir_;
				isLeftLegForeign = true;
			}

			if (obstacle2->isConvex_ && det(rightLegDirection, obstacle2->unitDir_) <= 0.0f) {
				/* Right leg points into obstacle. */
				rightLegDirection = obstacle2->unitDir_;
				isRightLegForeign = true;
			}

			/* Compute cut-off centers. */
			const Vector2 leftCutoff = invTimeHorizonObst * (obstacle1->point_ - position_);
			const Vector2 rightCutoff = invTimeHorizonObst * (obstacle2->point_ - position_);
			const Vector2 cutoffVec = rightCutoff - leftCutoff;

			/* Project current velocity on velocity obstacle. */

			/* Check if current velocity is projected on cutoff circles. */
			const float t = (obstacle1 == obstacle2 ? 0.5f : ((velocity_ - leftCutoff) * cutoffVec) / absSq(cutoffVec));
			const float tLeft = ((velocity_ - leftCutoff) * leftLegDirection);
			const float tRight = ((velocity_ - rightCutoff) * rightLegDirection);

			if ((t < 0.0f && tLeft < 0.0f) || (obstacle1 == obstacle2 && tLeft < 0.0f && tRight < 0.0f)) {
				/* Project on left cut-off circle. */
				const Vector2 unitW = normalize(velocity_ - leftCutoff);

				line.direction = Vector2(unitW.y(), -unitW.x());
				line.point = leftCutoff + radius_ * invTimeHorizonObst * unitW;
				orcaLines_.push_back(line);
				continue;
			}
			else if (t > 1.0f && tRight < 0.0f) {
				/* Project on right cut-off circle. */
				const Vector2 unitW = normalize(velocity_ - rightCutoff);

				line.direction = Vector2(unitW.y(), -unitW.x());
				line.point = rightCutoff + radius_ * invTimeHorizonObst * unitW;
				orcaLines_.push_back(line);
				continue;
			}

			/*
			 * Project on left leg, right leg, or cut-off line, whichever is closest
			 * to velocity.
			 */
			const float distSqCutoff = ((t < 0.0f || t > 1.0f || obstacle1 == obstacle2) ? std::numeric_limits<float>::infinity() : absSq(velocity_ - (leftCutoff + t * cutoffVec)));
			const float distSqLeft = ((tLeft < 0.0f) ? std::numeric_limits<float>::infinity() : absSq(velocity_ - (leftCutoff + tLeft * leftLegDirection)));
			const float distSqRight = ((tRight < 0.0f) ? std::numeric_limits<float>::infinity() : absSq(velocity_ - (rightCutoff + tRight * rightLegDirection)));

			if (distSqCutoff <= distSqLeft && distSqCutoff <= distSqRight) {
				/* Project on cut-off line. */
				line.direction = -obstacle1->unitDir_;
				line.point = leftCutoff + radius_ * invTimeHorizonObst * Vector2(-line.direction.y(), line.direction.x());
				orcaLines_.push_back(line);
				continue;
			}
			else if (distSqLeft <= distSqRight) {
				/* Project on left leg. */
				if (isLeftLegForeign) {
					continue;
				}

				line.direction = leftLegDirection;
				line.point = leftCutoff + radius_ * invTimeHorizonObst * Vector2(-line.direction.y(), line.direction.x());
				orcaLines_.push_back(line);
				continue;
			}
			else {
				/* Project on right leg. */
				if (isRightLegForeign) {
					continue;
				}

				line.direction = -rightLegDirection;
				line.point = rightCutoff + radius_ * invTimeHorizonObst * Vector2(-line.direction.y(), line.direction.x());
				orcaLines_.push_back(line);
				continue;
			}
		}

		const size_t numObstLines = orcaLines_.size();

		const float invTimeHorizon = 1.0f / timeHorizon_;

		/* Create agent ORCA lines. */
		for (size_t i = 0; i < agentNeighbors_.size(); ++i) {
			const Agent *const other = agentNeighbors_[i].second;

			const Vector2 relativePosition = other->position_ - position_;
			const Vector2 relativeVelocity = velocity_ - other->velocity_;
			const float distSq = absSq(relativePosition);
			const float combinedRadius = radius_ + other->radius_;
			const float combinedRadiusSq = sqr(combinedRadius);

			Line line;
			Vector2 u;

			if (distSq > combinedRadiusSq) {
				/* No collision. */
				const Vector2 w = relativeVelocity - invTimeHorizon * relativePosition;
				/* Vector from cutoff center to relative velocity. */
				const float wLengthSq = absSq(w);

				const float dotProduct1 = w * relativePosition;

				if (dotProduct1 < 0.0f && sqr(dotProduct1) > combinedRadiusSq * wLengthSq) {
					/* Project on cut-off circle. */
					const float wLength = std::sqrt(wLengthSq);
					const Vector2 unitW = w / wLength;

					line.direction = Vector2(unitW.y(), -unitW.x());
					u = (combinedRadius * invTimeHorizon - wLength) * unitW;
				}
				else {
					/* Project on legs. */
					const float leg = std::sqrt(distSq - combinedRadiusSq);

					if (det(relativePosition, w) > 0.0f) {
						/* Project on left leg. */
						line.direction = Vector2(relativePosition.x() * leg - relativePosition.y() * combinedRadius, relativePosition.x() * combinedRadius + relativePosition.y() * leg) / distSq;
					}
					else {
						/* Project on right leg. */
						line.direction = -Vector2(relativePosition.x() * leg + relativePosition.y() * combinedRadius, -relativePosition.x() * combinedRadius + relativePosition.y() * leg) / distSq;
					}

					const float dotProduct2 = relativeVelocity * line.direction;

					u = dotProduct2 * line.direction - relativeVelocity;
				}
			}
			else {
				/* Collision. Project on cut-off circle of time timeStep. */
				const float invTimeStep = 1.0f / sim_->timeStep_;

				/* Vector from cutoff center to relative velocity. */
				const Vector2 w = relativeVelocity - invTimeStep * relativePosition;

				const float wLength = abs(w);
				const Vector2 unitW = w / wLength;

				line.direction = Vector2(unitW.y(), -unitW.x());
				u = (combinedRadius * invTimeStep - wLength) * unitW;
			}

			line.point = velocity_ + 0.5f * u;
			orcaLines_.push_back(line);
		}

		size_t lineFail = linearProgram2(orcaLines_, maxSpeed_, prefVelocity_, false, newVelocity_);

		if (lineFail < orcaLines_.size()) {
			linearProgram3(orcaLines_, numObstLines, lineFail, maxSpeed_, newVelocity_);
		}
	}